

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O3

void test_multi_field_constructors<Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>>
               (void)

{
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> SVar1;
  Element_conflict EVar2;
  uint uVar3;
  uint __tmp;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> *local_1d0;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> *local_1c8;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_c2;
  undefined **local_1b8;
  undefined1 local_1b0;
  undefined8 *local_1a8;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> **local_1a0;
  undefined **local_198;
  undefined1 local_190;
  undefined8 *local_188;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> **local_180;
  undefined1 local_178 [8];
  undefined8 local_170;
  shared_count sStack_168;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> local_160;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> local_15c;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_c3;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_m2;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_v;
  char *local_148;
  char *local_140;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> local_138;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_d;
  undefined **local_130;
  undefined1 local_128;
  undefined8 *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  m_d.element_ = 0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x16a);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00132ae0;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  m_v.element_ = 0;
  local_178[0] = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_140 = "";
  local_1a0 = &local_1c8;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00132d60;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1d0;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00132c20;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = &m_v;
  local_1c8 = &m_d;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_168);
  uVar3 = 0x138e;
  if ((int)Gudhi::persistence_fields::
           Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>::
           productOfAllCharacteristics_ < 0x138f) {
    uVar3 = (uint)(0x138e % (ulong)Gudhi::persistence_fields::
                                   Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
                                   ::productOfAllCharacteristics_);
  }
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  m_v.element_ = uVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x16e);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00132ae0;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_1d0 = &m_c2;
  local_178[0] = uVar3 == 1 < Gudhi::persistence_fields::
                              Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
                              ::productOfAllCharacteristics_;
  m_c2.element_ = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_140 = "";
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00132d60;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00132c20;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1d0;
  local_1c8 = &m_v;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_168);
  uVar3 = 0x138e;
  if ((int)Gudhi::persistence_fields::
           Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>::
           productOfAllCharacteristics_ < 0x138f) {
    uVar3 = (uint)(0x138e % (ulong)Gudhi::persistence_fields::
                                   Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
                                   ::productOfAllCharacteristics_);
  }
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  m_c2.element_ = uVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x173);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00132ae0;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_1d0 = &m_c3;
  local_178[0] = uVar3 == 1 < Gudhi::persistence_fields::
                              Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
                              ::productOfAllCharacteristics_;
  m_c3.element_ = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_140 = "";
  local_1c8 = &m_c2;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00132d60;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00132c20;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_168);
  SVar1 = m_c2;
  m_c3 = m_c2;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x175);
  local_178[0] = SVar1.element_ ==
                 1 < Gudhi::persistence_fields::
                     Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>::
                     productOfAllCharacteristics_;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00132ae0;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_1c8 = &m_c3;
  m_m2.element_ = 1;
  local_1b0 = 0;
  local_190 = 0;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_140 = "";
  local_1b8 = &PTR__lazy_ostream_00132d60;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_198 = &PTR__lazy_ostream_00132c20;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1d0;
  local_1d0 = &m_m2;
  boost::test_tools::tt_detail::report_assertion
            (local_178,&local_130,&local_148,0x175,1,2,2,"m_c3",&local_1b8,"T(1)",&local_198);
  boost::detail::shared_count::~shared_count(&sStack_168);
  uVar3 = 0x138e;
  if ((int)Gudhi::persistence_fields::
           Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>::
           productOfAllCharacteristics_ < 0x138f) {
    uVar3 = (uint)(0x138e % (ulong)Gudhi::persistence_fields::
                                   Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
                                   ::productOfAllCharacteristics_);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  m_m2.element_ = uVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x17a);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00132ae0;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_1d0 = &local_15c;
  local_178[0] = uVar3 == 1 < Gudhi::persistence_fields::
                              Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
                              ::productOfAllCharacteristics_;
  local_15c.element_ = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_140 = "";
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00132d60;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00132c20;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1d0;
  local_1c8 = &m_m2;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_168);
  if ((int)Gudhi::persistence_fields::
           Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>::
           productOfAllCharacteristics_ < 0x138f) {
    uVar3 = (uint)(0x138e % (ulong)Gudhi::persistence_fields::
                                   Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
                                   ::productOfAllCharacteristics_);
    EVar2 = 0x138d;
    if (Gudhi::persistence_fields::
        Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>::
        productOfAllCharacteristics_ != 0x138e) {
      EVar2 = (Element_conflict)
              (0x138d % (ulong)Gudhi::persistence_fields::
                               Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
                               ::productOfAllCharacteristics_);
    }
  }
  else {
    EVar2 = 0x138d;
    uVar3 = 0x138e;
  }
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_15c.element_ = EVar2;
  local_138.element_ = uVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x181);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00132ae0;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_1d0 = &local_160;
  local_178[0] = uVar3 == 1 < Gudhi::persistence_fields::
                              Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>
                              ::productOfAllCharacteristics_;
  local_160.element_ = 1;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_140 = "";
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00132d60;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00132c20;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1d0;
  local_1c8 = &local_138;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_168);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x182);
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_00132ae0;
  local_120 = &boost::unit_test::lazy_ostream::inst;
  local_178[0] = EVar2 == 0;
  local_118 = "";
  local_160.element_ = 0;
  local_170 = 0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
  ;
  local_140 = "";
  local_1c8 = &local_15c;
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00132d60;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = &local_1c8;
  local_1d0 = &local_160;
  local_190 = 0;
  local_198 = &PTR__lazy_ostream_00132c20;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = &local_1d0;
  boost::test_tools::tt_detail::report_assertion
            (local_178,&local_130,&local_148,0x182,1,2,2,"m_s1",&local_1b8,"T(0)",&local_198);
  boost::detail::shared_count::~shared_count(&sStack_168);
  return;
}

Assistant:

void test_multi_field_constructors() {
  using T = typename MF::Element;

  // default constructor
  MF m_d;
  BOOST_CHECK_EQUAL(m_d, T(0));

  // value constructor
  MF m_v(5006);
  BOOST_CHECK_EQUAL(m_v, T(1));

  // copy constructor
  MF m_c1(5006);
  MF m_c2 = m_c1;
  BOOST_CHECK_EQUAL(m_c2, T(1));
  MF m_c3(m_c2);
  BOOST_CHECK_EQUAL(m_c3, T(1));

  // move constructor
  MF m_m1(5006);
  MF m_m2(std::move(m_m1));
  BOOST_CHECK_EQUAL(m_m2, T(1));
  // BOOST_CHECK_EQUAL(m_m1, T(0));   //does not work on windows

  // swap
  MF m_s1(5006);
  MF m_s2(5005);
  swap(m_s1, m_s2);
  BOOST_CHECK_EQUAL(m_s2, T(1));
  BOOST_CHECK_EQUAL(m_s1, T(0));
}